

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_2,_0>::getSiteLogLikelihoods
          (BeagleCPUImpl<double,_2,_0> *this,double *outLogLikelihoods)

{
  double *from;
  double *in_RSI;
  long in_RDI;
  int i;
  double *outLogLikelihoodsOriginalOrder;
  int local_1c;
  
  if ((*(byte *)(in_RDI + 0x51) & 1) == 0) {
    beagleMemCpy<double,double>(in_RSI,*(double **)(in_RDI + 0x110),*(uint *)(in_RDI + 0x14));
  }
  else {
    from = (double *)malloc((long)*(int *)(in_RDI + 0x14) << 3);
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x14); local_1c = local_1c + 1) {
      from[local_1c] =
           *(double *)
            (*(long *)(in_RDI + 0x110) +
            (long)*(int *)(*(long *)(in_RDI + 0x98) + (long)local_1c * 4) * 8);
    }
    beagleMemCpy<double,double>(in_RSI,from,*(uint *)(in_RDI + 0x14));
    free(from);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getSiteLogLikelihoods(double* outLogLikelihoods) {
    if (kPatternsReordered) {
        REALTYPE* outLogLikelihoodsOriginalOrder = (REALTYPE*) malloc(sizeof(REALTYPE) * kPatternCount);
        for (int i=0; i < kPatternCount; i++) {
            outLogLikelihoodsOriginalOrder[i] = outLogLikelihoodsTmp[gPatternsNewOrder[i]];
        }
        beagleMemCpy(outLogLikelihoods, outLogLikelihoodsOriginalOrder, kPatternCount);
        free(outLogLikelihoodsOriginalOrder);
    } else {
        beagleMemCpy(outLogLikelihoods, outLogLikelihoodsTmp, kPatternCount);
    }

    return BEAGLE_SUCCESS;
}